

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

type __thiscall
fakeit::MethodStubbingProgress<unsigned_long>::AlwaysReturn<unsigned_long>
          (MethodStubbingProgress<unsigned_long> *this,unsigned_long *r)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_member_pointer = *r;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7079:29)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7079:29)>
             ::_M_manager;
  (*this->_vptr_MethodStubbingProgress[3])();
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

typename std::enable_if<!std::is_reference<U>::value, void>::type
        AlwaysReturn(const R &r) {
            return AlwaysDo([r](const typename fakeit::test_arg<arglist>::type...) -> R { return r; });
        }